

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

int h2o_memis(void *_target,size_t target_len,void *_test,size_t test_len)

{
  uint uVar1;
  int iVar2;
  char *test;
  char *target;
  
  uVar1 = 0;
  if (target_len == test_len) {
    if (target_len == 0) {
      return 1;
    }
    if (*_target == *_test) {
      iVar2 = bcmp((void *)((long)_target + 1),(void *)((long)_test + 1),target_len - 1);
      uVar1 = (uint)(iVar2 == 0);
    }
  }
  return uVar1;
}

Assistant:

inline int h2o_memis(const void *_target, size_t target_len, const void *_test, size_t test_len)
{
    const char *target = (const char *)_target, *test = (const char *)_test;
    if (target_len != test_len)
        return 0;
    if (target_len == 0)
        return 1;
    if (target[0] != test[0])
        return 0;
    return memcmp(target + 1, test + 1, test_len - 1) == 0;
}